

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenshtein_distance.hpp
# Opt level: O3

int levenshtein_distance(string *s1,string *s2)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  size_type sVar4;
  size_type sVar5;
  pointer pcVar6;
  pointer pcVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  undefined4 *puVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  int iVar22;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int local_78;
  
  sVar4 = s1->_M_string_length;
  sVar5 = s2->_M_string_length;
  lVar17 = sVar4 << 0x20;
  uVar14 = 0xffffffffffffffff;
  if (-1 < lVar17 + 0x100000000) {
    uVar14 = lVar17 + 0x100000000 >> 0x1e;
  }
  puVar13 = (undefined4 *)operator_new__(uVar14);
  auVar10 = _DAT_00113030;
  auVar9 = _DAT_00113020;
  auVar8 = _DAT_00113010;
  if (lVar17 != 0) {
    uVar14 = (lVar17 >> 0x1e) - 4;
    auVar24._8_4_ = (int)uVar14;
    auVar24._0_8_ = uVar14;
    auVar24._12_4_ = (int)(uVar14 >> 0x20);
    auVar21._0_8_ = uVar14 >> 2;
    auVar21._8_8_ = auVar24._8_8_ >> 2;
    uVar16 = 0;
    auVar21 = auVar21 ^ _DAT_00113030;
    do {
      iVar11 = (int)uVar16;
      auVar23._8_4_ = iVar11;
      auVar23._0_8_ = uVar16;
      auVar23._12_4_ = (int)(uVar16 >> 0x20);
      auVar24 = (auVar23 | auVar9) ^ auVar10;
      iVar22 = auVar21._4_4_;
      if ((bool)(~(auVar24._4_4_ == iVar22 && auVar21._0_4_ < auVar24._0_4_ ||
                  iVar22 < auVar24._4_4_) & 1)) {
        puVar13[uVar16 + 1] = iVar11 + 1;
      }
      if ((auVar24._12_4_ != auVar21._12_4_ || auVar24._8_4_ <= auVar21._8_4_) &&
          auVar24._12_4_ <= auVar21._12_4_) {
        puVar13[uVar16 + 2] = iVar11 + 2;
      }
      auVar24 = (auVar23 | auVar8) ^ auVar10;
      iVar12 = auVar24._4_4_;
      if (iVar12 <= iVar22 && (iVar12 != iVar22 || auVar24._0_4_ <= auVar21._0_4_)) {
        puVar13[uVar16 + 3] = iVar11 + 3;
        puVar13[uVar16 + 4] = iVar11 + 4;
      }
      uVar16 = uVar16 + 4;
    } while (((uVar14 >> 2) + 4 & 0xfffffffffffffffc) != uVar16);
  }
  local_78 = (int)sVar5;
  if (0 < local_78) {
    pcVar6 = (s1->_M_dataplus)._M_p;
    pcVar7 = (s2->_M_dataplus)._M_p;
    iVar22 = (int)sVar4;
    uVar14 = 1;
    do {
      *puVar13 = (int)uVar14;
      if (0 < iVar22) {
        lVar18 = 0;
        uVar16 = uVar14 & 0xffffffff;
        uVar20 = uVar14 - 1 & 0xffffffff;
        do {
          uVar3 = puVar13[lVar18 + 1];
          cVar1 = pcVar6[lVar18];
          cVar2 = pcVar7[uVar14 - 1];
          iVar11 = 0;
          if (cVar1 != cVar2) {
            iVar11 = tolower((int)cVar1);
            iVar12 = tolower((int)cVar2);
            iVar11 = (iVar11 != iVar12) + 1;
          }
          uVar15 = uVar3 + 4;
          uVar19 = (int)uVar16 + 4;
          if ((int)uVar15 <= (int)uVar19) {
            uVar19 = uVar15;
          }
          uVar15 = iVar11 + (int)uVar20;
          if ((int)uVar15 < (int)uVar19) {
            uVar19 = uVar15;
          }
          uVar16 = (ulong)uVar19;
          puVar13[lVar18 + 1] = uVar19;
          lVar18 = lVar18 + 1;
          uVar20 = (ulong)uVar3;
        } while ((ulong)(iVar22 + 1) - 1 != lVar18);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != local_78 + 1);
  }
  iVar22 = *(int *)((long)puVar13 + (lVar17 >> 0x1e));
  operator_delete__(puVar13);
  return iVar22;
}

Assistant:

int levenshtein_distance(const std::string &s1, const std::string &s2) {
  // To change the type this function manipulates and returns, change
  // the return type and the types of the two variables below.
  int s1len = s1.size();
  int s2len = s2.size();

  int column_start = 1;

  int *column = new int[s1len + 1];
  std::iota(column + column_start, column + s1len + 1, column_start);

  constexpr int insert_cost = 4;
  constexpr int change_cost = 2;
  constexpr int capitalize_cost = 1;

  for (int x = column_start; x <= s2len; x++) {
    column[0] = x;
    int last_diagonal = x - column_start;
    for (int y = column_start; y <= s1len; y++) {
      int old_diagonal = column[y];

      char c1 = s1[y - 1];
      char c2 = s2[x - 1];
      int diff_cost;
      if (c1 == c2) {
        diff_cost = 0;
      } else if (std::tolower(c1) == std::tolower(c2)) {
        diff_cost = capitalize_cost;
      } else {
        diff_cost = change_cost;
      }

      // clang-format off
      column[y] = std::min({
        column[y] + insert_cost,
        column[y - 1] + insert_cost,
        last_diagonal + diff_cost
      });
      // clang-format on
      last_diagonal = old_diagonal;
    }
  }
  int result = column[s1len];
  delete[] column;
  return result;
}